

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O2

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  ulong uVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  FSE_CTable FVar9;
  FSE_CTable FVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ushort uVar15;
  ulong uVar16;
  uint uVar17;
  
  uVar12 = 1 << ((byte)tableLog & 0x1f);
  uVar4 = 1;
  if (tableLog != 0) {
    uVar4 = uVar12 >> 1;
  }
  if (((ulong)workSpace & 3) == 0) {
    uVar13 = (ulong)(maxSymbolValue + 2);
    if (wkspSize < ((1L << ((byte)tableLog - 2 & 0x3f)) + uVar13) * 4) {
      sVar5 = 0xffffffffffffffd4;
    }
    else {
      *(short *)ct = (short)tableLog;
      *(short *)((long)ct + 2) = (short)maxSymbolValue;
      *(undefined4 *)workSpace = 0;
      uVar6 = (ulong)(maxSymbolValue + 1);
      uVar8 = (ulong)(uVar12 - 1);
      uVar16 = 0;
      while( true ) {
        uVar1 = uVar16 + 1;
        if (uVar6 < uVar1) break;
        if (normalizedCounter[uVar16] == -1) {
          *(int *)((long)workSpace + uVar16 * 4 + 4) = *(int *)((long)workSpace + uVar16 * 4) + 1;
          *(char *)((long)workSpace + uVar8 + uVar13 * 4) = (char)uVar16;
          uVar8 = (ulong)((uint)uVar8 - 1);
          uVar16 = uVar1;
        }
        else {
          *(int *)((long)workSpace + uVar16 * 4 + 4) =
               (int)normalizedCounter[uVar16] + *(int *)((long)workSpace + uVar16 * 4);
          uVar16 = uVar1;
        }
      }
      *(uint *)((long)workSpace + uVar6 * 4) = uVar12 + 1;
      uVar17 = 0;
      for (uVar16 = 0; uVar16 != uVar6; uVar16 = uVar16 + 1) {
        uVar15 = normalizedCounter[uVar16];
        uVar14 = 0;
        if ((short)uVar15 < 1) {
          uVar15 = 0;
        }
        for (; uVar14 != uVar15; uVar14 = uVar14 + 1) {
          *(char *)((long)workSpace + (ulong)uVar17 + uVar13 * 4) = (char)uVar16;
          do {
            uVar17 = uVar17 + (uVar12 >> 3) + (uVar12 >> 1) + 3 & uVar12 - 1;
          } while ((uint)uVar8 < uVar17);
        }
      }
      for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
        uVar16 = (ulong)*(byte *)((long)workSpace + uVar8 + uVar13 * 4);
        uVar17 = *(uint *)((long)workSpace + uVar16 * 4);
        *(uint *)((long)workSpace + uVar16 * 4) = uVar17 + 1;
        *(short *)((long)ct + (ulong)uVar17 * 2 + 4) = (short)uVar12 + (short)uVar8;
      }
      FVar10 = tableLog * 0x10000 - uVar12;
      sVar5 = 0;
      iVar7 = 0;
      for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
        sVar2 = normalizedCounter[uVar13];
        if ((sVar2 == -1) || (sVar2 == 1)) {
          ct[(ulong)uVar4 + uVar13 * 2 + 2] = FVar10;
          ct[(ulong)uVar4 + uVar13 * 2 + 1] = iVar7 - 1;
          iVar7 = iVar7 + 1;
        }
        else if (sVar2 == 0) {
          ct[(ulong)uVar4 + uVar13 * 2 + 2] = FVar10 + 0x10000;
        }
        else {
          iVar11 = (int)sVar2;
          iVar3 = 0x1f;
          if (iVar11 - 1U != 0) {
            for (; iVar11 - 1U >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          FVar9 = iVar7 - iVar11;
          iVar7 = iVar7 + iVar11;
          ct[(ulong)uVar4 + uVar13 * 2 + 2] =
               (tableLog - iVar3) * 0x10000 - (iVar11 << ((byte)(tableLog - iVar3) & 0x1f));
          ct[(ulong)uVar4 + uVar13 * 2 + 1] = FVar9;
        }
      }
    }
  }
  else {
    sVar5 = 0xffffffffffffffff;
  }
  return sVar5;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);

    U32* cumul = (U32*)workSpace;
    FSE_FUNCTION_TYPE* tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSymbolValue + 2));

    U32 highThreshold = tableSize-1;

    if ((size_t)workSpace & 3) return ERROR(GENERIC); /* Must be 4 byte aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * http://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSymbolValue+1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                cumul[u] = cumul[u-1] + normalizedCounter[u-1];
        }   }
        cumul[maxSymbolValue+1] = tableSize+1;
    }

    /* Spread symbols */
    {   U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }

        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                symbolTT[s].deltaFindState = total - 1;
                total ++;
                break;
            default :
                {
                    U32 const maxBitsOut = tableLog - BIT_highbit32 (normalizedCounter[s]-1);
                    U32 const minStatePlus = normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = total - normalizedCounter[s];
                    total +=  normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
        }
    }
#endif

    return 0;
}